

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSValue js_os_utimes(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue val1;
  JSValue val;
  JSValue val_00;
  JSValue JVar1;
  int iVar2;
  char *__file;
  ssize_t sVar3;
  timeval times [2];
  int ret;
  int64_t mtime;
  int64_t atime;
  char *path;
  JSValueUnion in_stack_ffffffffffffff58;
  int64_t in_stack_ffffffffffffff60;
  timeval *tv;
  char *in_stack_ffffffffffffff68;
  JSContext *in_stack_ffffffffffffff70;
  int64_t *in_stack_ffffffffffffff78;
  JSContext *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  uint64_t in_stack_ffffffffffffff90;
  uint64_t local_68;
  undefined4 local_30;
  undefined4 uStack_2c;
  int64_t local_28;
  undefined4 uStack_c;
  
  val.u._4_4_ = in_stack_ffffffffffffff8c;
  val.u.int32 = in_stack_ffffffffffffff88;
  val.tag = in_stack_ffffffffffffff90;
  iVar2 = JS_ToInt64(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,val);
  if (iVar2 == 0) {
    val_00.u._4_4_ = in_stack_ffffffffffffff8c;
    val_00.u.int32 = in_stack_ffffffffffffff88;
    val_00.tag = in_stack_ffffffffffffff90;
    iVar2 = JS_ToInt64(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,val_00);
    if (iVar2 == 0) {
      val1.tag = in_stack_ffffffffffffff60;
      val1.u.float64 = in_stack_ffffffffffffff58.float64;
      __file = JS_ToCString((JSContext *)0x116f29,val1);
      if (__file == (char *)0x0) {
        local_30 = 0;
        local_28 = 6;
      }
      else {
        tv = (timeval *)&stack0xffffffffffffff68;
        ms_to_timeval(tv,local_68);
        ms_to_timeval((timeval *)&stack0xffffffffffffff78,in_stack_ffffffffffffff90);
        utimes(__file,(timeval *)tv);
        sVar3 = js_get_errno(0x116f89);
        local_30 = (undefined4)sVar3;
        JS_FreeCString(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        uStack_2c = uStack_c;
        local_28 = 0;
      }
    }
    else {
      local_30 = 0;
      local_28 = 6;
    }
  }
  else {
    local_30 = 0;
    local_28 = 6;
  }
  JVar1.u._4_4_ = uStack_2c;
  JVar1.u.int32 = local_30;
  JVar1.tag = local_28;
  return JVar1;
}

Assistant:

static JSValue js_os_utimes(JSContext *ctx, JSValueConst this_val,
                            int argc, JSValueConst *argv)
{
    const char *path;
    int64_t atime, mtime;
    int ret;
    
    if (JS_ToInt64(ctx, &atime, argv[1]))
        return JS_EXCEPTION;
    if (JS_ToInt64(ctx, &mtime, argv[2]))
        return JS_EXCEPTION;
    path = JS_ToCString(ctx, argv[0]);
    if (!path)
        return JS_EXCEPTION;
#if defined(_WIN32)
    {
        struct _utimbuf times;
        times.actime = atime / 1000;
        times.modtime = mtime / 1000;
        ret = js_get_errno(_utime(path, &times));
    }
#else
    {
        struct timeval times[2];
        ms_to_timeval(&times[0], atime);
        ms_to_timeval(&times[1], mtime);
        ret = js_get_errno(utimes(path, times));
    }
#endif
    JS_FreeCString(ctx, path);
    return JS_NewInt32(ctx, ret);
}